

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidget::setColorBufferFormat(QRhiWidget *this,TextureFormat format)

{
  QRhiWidgetPrivate *pQVar1;
  QWidget *this_00;
  TextureFormat in_ESI;
  QRhiWidgetPrivate *d;
  
  pQVar1 = d_func((QRhiWidget *)0x349c00);
  if (pQVar1->widgetTextureFormat != in_ESI) {
    pQVar1->widgetTextureFormat = in_ESI;
    this_00 = (QWidget *)(ulong)in_ESI;
    switch(this_00) {
    case (QWidget *)0x0:
      pQVar1->rhiTextureFormat = RGBA8;
      break;
    case (QWidget *)0x1:
      pQVar1->rhiTextureFormat = RGBA16F;
      break;
    case (QWidget *)0x2:
      pQVar1->rhiTextureFormat = RGBA32F;
      break;
    case (QWidget *)0x3:
      pQVar1->rhiTextureFormat = RGB10A2;
    }
    colorBufferFormatChanged((QRhiWidget *)0x349c9c,RGBA8);
    QWidget::update(this_00);
  }
  return;
}

Assistant:

void QRhiWidget::setColorBufferFormat(TextureFormat format)
{
    Q_D(QRhiWidget);
    if (d->widgetTextureFormat != format) {
        d->widgetTextureFormat = format;
        switch (format) {
        case TextureFormat::RGBA8:
            d->rhiTextureFormat = QRhiTexture::RGBA8;
            break;
        case TextureFormat::RGBA16F:
            d->rhiTextureFormat = QRhiTexture::RGBA16F;
            break;
        case TextureFormat::RGBA32F:
            d->rhiTextureFormat = QRhiTexture::RGBA32F;
            break;
        case TextureFormat::RGB10A2:
            d->rhiTextureFormat = QRhiTexture::RGB10A2;
            break;
        }
        emit colorBufferFormatChanged(format);
        update();
    }
}